

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_10d873::TryGetMemberAccessPointerAndOffset
                    (ExpressionContext *ctx,VmInstruction *address,VmConstant *offset,
                    VmConstant **totalOffset)

{
  uint uVar1;
  bool bVar2;
  VmValue *pVVar3;
  VmConstant *pVVar4;
  VmValue **ppVVar5;
  VmValue *pVVar6;
  
  if (address->cmd != VM_INST_ADD) {
    return (VmValue *)0x0;
  }
  uVar1 = (address->arguments).count;
  if (uVar1 == 0) {
LAB_001a2a9e:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  ppVVar5 = (address->arguments).data;
  pVVar3 = *ppVVar5;
  if ((pVVar3 == (VmValue *)0x0) || (pVVar3->typeID != 1)) {
    pVVar3 = (VmValue *)0x0;
  }
  if (uVar1 == 1) goto LAB_001a2a9e;
  pVVar6 = ppVVar5[1];
  if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
    pVVar6 = (VmValue *)0x0;
  }
  if ((pVVar3 == (VmValue *)0x0) ||
     (pVVar3[1].comment.end != (char *)0x0 || pVVar6 != (VmValue *)0x0)) {
    bVar2 = true;
    if ((pVVar6 == (VmValue *)0x0) ||
       (pVVar3 = (VmValue *)((ulong)pVVar3 | (ulong)pVVar6[1].comment.end), pVVar3 != (VmValue *)0x0
       )) goto LAB_001a2a8f;
    pVVar4 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,
                               *(int *)&pVVar6[1]._vptr_VmValue + offset->iValue);
    *totalOffset = pVVar4;
    if ((address->arguments).count == 0) goto LAB_001a2a9e;
    ppVVar5 = (address->arguments).data;
  }
  else {
    pVVar4 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,
                               *(int *)&pVVar3[1]._vptr_VmValue + offset->iValue);
    *totalOffset = pVVar4;
    if ((address->arguments).count < 2) goto LAB_001a2a9e;
    ppVVar5 = (address->arguments).data + 1;
  }
  pVVar3 = *ppVVar5;
  bVar2 = false;
LAB_001a2a8f:
  if (bVar2) {
    return (VmValue *)0x0;
  }
  return pVVar3;
}

Assistant:

VmValue* TryGetMemberAccessPointerAndOffset(ExpressionContext &ctx, VmInstruction *address, VmConstant *offset, VmConstant **totalOffset)
	{
		if(address->cmd == VM_INST_ADD)
		{
			VmConstant *lhsAsConstant = getType<VmConstant>(address->arguments[0]);
			VmConstant *rhsAsConstant = getType<VmConstant>(address->arguments[1]);

			if(lhsAsConstant && !lhsAsConstant->container && !rhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + lhsAsConstant->iValue);

				return address->arguments[1];
			}
			else if(rhsAsConstant && !rhsAsConstant->container && !lhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + rhsAsConstant->iValue);

				return address->arguments[0];
			}
		}

		return NULL;
	}